

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmTest *pcVar1;
  pointer pbVar2;
  TargetType TVar3;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ostream *poVar5;
  cmGeneratorTarget *this_00;
  string *psVar6;
  _Base_ptr p_Var7;
  char *__s;
  pointer pbVar8;
  string emulatorExe;
  string local_c8;
  string *local_a8;
  ostream *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string exe;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->TestGenerated = true;
  local_a8 = config;
  p_Var4 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
           cmTest::GetBacktrace(this->Test);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,p_Var4);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"add_test(");
  std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&exe);
  std::operator<<(poVar5," ");
  std::__cxx11::string::~string((string *)&exe);
  pcVar1 = this->Test;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar1->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,&exe);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (TVar3 == EXECUTABLE) {
      cmGeneratorTarget::GetFullPath(&emulatorExe,this_00,local_a8,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&local_c8);
      __s = cmGeneratorTarget::GetProperty(this_00,&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&emulatorExe,__s,(allocator<char> *)&local_c8);
        cmSystemTools::ExpandListArgument(&emulatorExe,&emulatorWithArgs,false);
        std::__cxx11::string::~string((string *)&emulatorExe);
        std::__cxx11::string::string
                  ((string *)&emulatorExe,
                   (string *)
                   emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
        cmOutputConverter::EscapeForCMake(&local_c8,&emulatorExe);
        poVar5 = std::operator<<(os,(string *)&local_c8);
        std::operator<<(poVar5," ");
        std::__cxx11::string::~string((string *)&local_c8);
        pbVar8 = emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar6 = emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (psVar6 = psVar6 + 1, psVar6 != pbVar8) {
          cmOutputConverter::EscapeForCMake(&local_c8,psVar6);
          poVar5 = std::operator<<(os,(string *)&local_c8);
          std::operator<<(poVar5," ");
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::__cxx11::string::~string((string *)&emulatorExe);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&emulatorWithArgs);
      }
      goto LAB_0021eb1d;
    }
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_c8,(string *)&ge);
  emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
  emulatorExe._M_string_length = 0;
  emulatorExe.field_2._M_local_buf[0] = '\0';
  cmCompiledGeneratorExpression::Evaluate
            ((cmCompiledGeneratorExpression *)local_c8._M_dataplus._M_p,this->LG,local_a8,false,
             (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,&emulatorExe);
  std::__cxx11::string::_M_assign((string *)&exe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_c8);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
LAB_0021eb1d:
  cmOutputConverter::EscapeForCMake(&emulatorExe,&exe);
  local_a0 = os;
  std::operator<<(os,(string *)&emulatorExe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  pbVar8 = (pcVar1->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pcVar1->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (poVar5 = local_a0, pbVar8 = pbVar8 + 1, pbVar8 != pbVar2) {
    poVar5 = std::operator<<(local_a0," ");
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&emulatorWithArgs,(string *)&ge);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        emulatorWithArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,this->LG,local_a8,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_c8);
    cmOutputConverter::EscapeForCMake(&emulatorExe,psVar6);
    std::operator<<(poVar5,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&emulatorWithArgs);
  }
  std::operator<<(local_a0,")\n");
  pcVar1 = this->Test;
  poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"set_tests_properties(");
  std::__cxx11::string::string((string *)&emulatorExe,(string *)&this->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&emulatorExe);
  std::operator<<(poVar5," PROPERTIES ");
  std::__cxx11::string::~string((string *)&emulatorExe);
  for (p_Var7 = (pcVar1->Properties).
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left; poVar5 = local_a0,
      (_Rb_tree_header *)p_Var7 !=
      &(pcVar1->Properties).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar5 = std::operator<<(local_a0," ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var7 + 1));
    poVar5 = std::operator<<(poVar5," ");
    cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&emulatorWithArgs,(char *)&ge);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        emulatorWithArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,this->LG,local_a8,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_c8);
    cmOutputConverter::EscapeForCMake(&emulatorExe,psVar6);
    std::operator<<(poVar5,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&emulatorWithArgs);
  }
  GenerateInternalProperties(this,local_a0);
  poVar5 = std::operator<<(poVar5,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&exe);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char* emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != nullptr && *emulator) {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
        os << cmOutputConverter::EscapeForCMake(arg) << " ";
      }
    }
  } else {
    // Use the command name given.
    exe = ge.Parse(exe)->Evaluate(this->LG, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    os << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(arg)->Evaluate(this->LG, config));
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  os << indent << "set_tests_properties(" << this->Test->GetName()
     << " PROPERTIES ";
  for (auto const& i : pm) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second.GetValue())->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")" << std::endl;
}